

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O2

ReadResult * __thiscall
AsyncRgbLedAnalyzer::ReadBit(ReadResult *__return_storage_ptr__,AsyncRgbLedAnalyzer *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  U64 UVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  ulong uVar8;
  BitState value;
  char *pcVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double t;
  BitTiming local_60;
  
  *(undefined8 *)&__return_storage_ptr__->mBitValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->mBeginSample + 4) = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->mEndSample + 4) = 0;
  __return_storage_ptr__->mValid = false;
  __return_storage_ptr__->mIsReset = false;
  iVar3 = AnalyzerChannelData::GetBitState();
  if (iVar3 == 0) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  UVar4 = AnalyzerChannelData::GetSampleNumber();
  __return_storage_ptr__->mBeginSample = UVar4;
  AnalyzerChannelData::AdvanceToNextEdge();
  lVar5 = AnalyzerChannelData::GetSampleNumber();
  lVar6 = lVar5 - UVar4;
  auVar10._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar10._0_8_ = lVar6;
  auVar10._12_4_ = 0x45300000;
  dVar13 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / this->mSampleRateHz;
  value = BIT_LOW;
  if (this->mFirstBitAfterReset == false) {
    value = BIT_LOW;
    AsyncRgbLedAnalyzerSettings::DataTiming
              (&local_60,
               (this->mSettings)._M_t.
               super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               ._M_t.
               super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,BIT_LOW,
               this->mDidDetectHighSpeed);
    bVar1 = TimingTolerance::WithinTolerance(&local_60.mPositiveTiming,dVar13);
    if (!bVar1) {
      value = BIT_HIGH;
      AsyncRgbLedAnalyzerSettings::DataTiming
                (&local_60,
                 (this->mSettings)._M_t.
                 super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,BIT_HIGH,
                 this->mDidDetectHighSpeed);
      bVar1 = TimingTolerance::WithinTolerance(&local_60.mPositiveTiming,dVar13);
      if (!bVar1) {
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "positive pulse timing doesn\'t match detected speed mode");
        std::endl<char,std::char_traits<char>>(poVar7);
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mChannelData);
        return __return_storage_ptr__;
      }
    }
    __return_storage_ptr__->mBitValue = value;
  }
  cVar2 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mChannelData);
  if (cVar2 == '\0') {
    AsyncRgbLedAnalyzerSettings::ResetTiming
              (&local_60.mPositiveTiming,
               (this->mSettings)._M_t.
               super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               ._M_t.
               super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl);
    cVar2 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mChannelData);
    if (cVar2 != '\0') {
      AnalyzerChannelData::AdvanceToNextEdge();
      lVar6 = AnalyzerChannelData::GetSampleNumber();
      __return_storage_ptr__->mEndSample = lVar6 - 1U;
      lVar5 = (lVar6 - 1U) - lVar5;
      auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar11._0_8_ = lVar5;
      auVar11._12_4_ = 0x45300000;
      t = ((auVar11._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / this->mSampleRateHz;
      if (this->mFirstBitAfterReset == true) {
        bVar1 = DetectSpeedMode(this,dVar13,t,&__return_storage_ptr__->mBitValue);
        __return_storage_ptr__->mValid = bVar1;
        return __return_storage_ptr__;
      }
      AsyncRgbLedAnalyzerSettings::DataTiming
                (&local_60,
                 (this->mSettings)._M_t.
                 super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,value,
                 this->mDidDetectHighSpeed);
      bVar1 = TimingTolerance::WithinTolerance(&local_60.mNegativeTiming,t);
      if (!bVar1) {
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "negative pulse timing doesn\'t match positive pulse");
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      __return_storage_ptr__->mValid = bVar1;
      return __return_storage_ptr__;
    }
    if (this->mFirstBitAfterReset != true) {
      AnalyzerChannelData::Advance((uint)this->mChannelData);
      __return_storage_ptr__->mValid = true;
      __return_storage_ptr__->mIsReset = true;
      AsyncRgbLedAnalyzerSettings::DataTiming
                (&local_60,
                 (this->mSettings)._M_t.
                 super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,value,
                 this->mDidDetectHighSpeed);
      auVar12._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar12._0_8_ = lVar5;
      auVar12._12_4_ = 0x45300000;
      dVar13 = local_60.mNegativeTiming.mNominalSec * this->mSampleRateHz +
               (auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
      uVar8 = (ulong)dVar13;
      __return_storage_ptr__->mEndSample =
           (long)(dVar13 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
      return __return_storage_ptr__;
    }
    pcVar9 = "No complete bit between resets, can\'t decode";
  }
  else {
    AnalyzerChannelData::AdvanceToNextEdge();
    pcVar9 = "too show low pulse, invalid bit";
  }
  poVar7 = std::operator<<((ostream *)&std::cerr,pcVar9);
  std::endl<char,std::char_traits<char>>(poVar7);
  return __return_storage_ptr__;
}

Assistant:

auto AsyncRgbLedAnalyzer::ReadBit() -> ReadResult
{
    ReadResult result;
    result.mValid = false;

    if( mChannelData->GetBitState() == BIT_LOW )
    {
        mChannelData->AdvanceToNextEdge();
    }

    result.mBeginSample = mChannelData->GetSampleNumber();
    mChannelData->AdvanceToNextEdge();
    const U64 fallingEdgeSample = mChannelData->GetSampleNumber();
    const double highTimeSec = ( fallingEdgeSample - result.mBeginSample ) / mSampleRateHz;

    if( mFirstBitAfterReset )
    {
        // we can't classify yet, need to wait until we have the low pulse timing
    }
    else
    {
        // clasify based on existing value
        // ensure consistency with previously detected speed setting
        if( mSettings->DataTiming( BIT_LOW, mDidDetectHighSpeed ).mPositiveTiming.WithinTolerance( highTimeSec ) )
        {
            result.mBitValue = BIT_LOW;
        }
        else if( mSettings->DataTiming( BIT_HIGH, mDidDetectHighSpeed ).mPositiveTiming.WithinTolerance( highTimeSec ) )
        {
            result.mBitValue = BIT_HIGH;
        }
        else
        {
            std::cerr << "positive pulse timing doesn't match detected speed mode" << std::endl;
            mChannelData->AdvanceToAbsPosition( fallingEdgeSample );
            return result; // invalid result, reset required
        }
    }

    // check for a too-short low timing
    if( mChannelData->WouldAdvancingCauseTransition( mMinimumLowDurationSec * mSampleRateHz ) )
    {
        mChannelData->AdvanceToNextEdge();
        std::cerr << "too show low pulse, invalid bit" << std::endl;
        return result; // invalid result, reset required
    }

    // check for a low period exceeding the minimum reset time
    // if we exceed that, this is a reset
    const int minResetSamples = static_cast<int>( mSettings->ResetTiming().mMinimumSec * mSampleRateHz );

    if( !mChannelData->WouldAdvancingCauseTransition( minResetSamples ) )
    {
        // if we see a single bit in between resets, we can't decode the speed,
        // but this is meaningless anyway, so return an error
        if( mFirstBitAfterReset )
        {
            std::cerr << "No complete bit between resets, can't decode" << std::endl;
            return result; // return invalid
        }

        mChannelData->Advance( minResetSamples );
        result.mIsReset = true;
    }
    else
    {
        // we saw a transition, let's see the timing
        mChannelData->AdvanceToNextEdge();

        // the -1 is so the end of this frame, and start of the next, don't
        // overlap.
        result.mEndSample = mChannelData->GetSampleNumber() - 1;
    }

    if( result.mIsReset )
    {
        // if this bit is also a reset, we can't check the low time since it
        // will exceed the maximums, but we still want to accept that case
        // as valid
        result.mValid = true;

        // use the nominal negative pulse timing for the frame ending.
        double nominalNegativeSec = mSettings->DataTiming( result.mBitValue, mDidDetectHighSpeed ).mNegativeTiming.mNominalSec;
        result.mEndSample = fallingEdgeSample + ( nominalNegativeSec * mSampleRateHz );
    }
    else if( mFirstBitAfterReset )
    {
        const double lowTimeSec = ( result.mEndSample - fallingEdgeSample ) / mSampleRateHz;
        // two-way classification. This is necessary because the the 0-data
        // positive pulse of low-speed mode can match the 1-data positive pulse
        // in high speed mode, for some controllers. Hence we need to correlate
        // the high and low times to detect the speed mode

        // this also sets mBitValue correct as a side-effect of the detection
        result.mValid = DetectSpeedMode( highTimeSec, lowTimeSec, result.mBitValue );
    }
    else
    {
        // already detected the speed mode, ensure consistency
        const double lowTimeSec = ( result.mEndSample - fallingEdgeSample ) / mSampleRateHz;

        if( mSettings->DataTiming( result.mBitValue, mDidDetectHighSpeed ).mNegativeTiming.WithinTolerance( lowTimeSec ) )
        {
            // we are good
            result.mValid = true;
        }
        else
        {
            // we could do further classification here on the error, eg speed mismatch,
            // or bit value mismatch
            std::cerr << "negative pulse timing doesn't match positive pulse" << std::endl;
            result.mValid = false;
        }
    }

    return result;
}